

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_sl.c
# Opt level: O3

sylvan_skiplist_t sylvan_skiplist_alloc(size_t size)

{
  sylvan_skiplist_t psVar1;
  sl_bucket *psVar2;
  sylvan_skiplist_t extraout_RAX;
  undefined8 *unaff_R15;
  
  if (size >> 0x1f == 0) {
    psVar1 = (sylvan_skiplist_t)malloc(0x18);
    unaff_R15 = (undefined8 *)(size << 6);
    psVar2 = (sl_bucket *)mmap((void *)0x0,(size_t)unaff_R15,3,0x22,-1,0);
    if (psVar2 == (sl_bucket *)0xffffffffffffffff) {
      psVar2 = (sl_bucket *)0x0;
    }
    psVar1->buckets = psVar2;
    if (psVar2 != (sl_bucket *)0x0) {
      psVar1->size = size;
      LOCK();
      psVar1->next = 1;
      UNLOCK();
      return psVar1;
    }
  }
  else {
    sylvan_skiplist_alloc_cold_2();
  }
  sylvan_skiplist_alloc_cold_1();
  munmap((void *)*unaff_R15,unaff_R15[1] << 6);
  free(unaff_R15);
  return extraout_RAX;
}

Assistant:

sylvan_skiplist_t
sylvan_skiplist_alloc(size_t size)
{
    if (size >= 0x80000000) {
        fprintf(stderr, "sylvan: Trying to allocate a skiplist >= 0x80000000 buckets!\n");
        exit(1);
    }
    sylvan_skiplist_t l = malloc(sizeof(struct sylvan_skiplist));
    l->buckets = alloc_aligned(sizeof(sl_bucket) * size);
    if (l->buckets == 0) {
        fprintf(stderr, "sylvan: Unable to allocate virtual memory (%'zu bytes) for the skiplist!\n", size*sizeof(sl_bucket));
        exit(1);
    }
    l->size = size;
    l->next = 1;
    return l;
}